

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2text_format.cc
# Opt level: O2

bool __thiscall
s2textformat::ParsePoints
          (s2textformat *this,string_view str,
          vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *vertices)

{
  pointer pSVar1;
  bool bVar2;
  vector<S2LatLng,_std::allocator<S2LatLng>_> *__range1;
  S2LatLng *latlng;
  pointer this_00;
  string_view str_00;
  vector<S2LatLng,_std::allocator<S2LatLng>_> latlngs;
  _Vector_base<S2LatLng,_std::allocator<S2LatLng>_> local_58;
  S2Point local_40;
  
  str_00.length_ = str.ptr_;
  local_58._M_impl.super__Vector_impl_data._M_start = (S2LatLng *)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (S2LatLng *)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  str_00.ptr_ = (char *)this;
  bVar2 = ParseLatLngs(str_00,(vector<S2LatLng,_std::allocator<S2LatLng>_> *)&local_58);
  pSVar1 = local_58._M_impl.super__Vector_impl_data._M_finish;
  if (bVar2) {
    for (this_00 = local_58._M_impl.super__Vector_impl_data._M_start; this_00 != pSVar1;
        this_00 = this_00 + 1) {
      S2LatLng::ToPoint(&local_40,this_00);
      std::vector<Vector3<double>,std::allocator<Vector3<double>>>::emplace_back<Vector3<double>>
                ((vector<Vector3<double>,std::allocator<Vector3<double>>> *)str.length_,&local_40);
    }
  }
  std::_Vector_base<S2LatLng,_std::allocator<S2LatLng>_>::~_Vector_base(&local_58);
  return bVar2;
}

Assistant:

bool ParsePoints(string_view str, vector<S2Point>* vertices) {
  vector<S2LatLng> latlngs;
  if (!ParseLatLngs(str, &latlngs)) return false;
  for (const auto& latlng : latlngs) {
    vertices->push_back(latlng.ToPoint());
  }
  return true;
}